

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O1

int lreadline(lua_State *L)

{
  bool bVar1;
  int skip;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  socket_buffer *psVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  buffer_node *pbVar11;
  buffer_node *pbVar12;
  long lVar13;
  ulong uVar14;
  char *__s2;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  size_t seplen;
  size_t local_50;
  socket_buffer *local_48;
  char *local_40;
  buffer_node *local_38;
  
  psVar6 = (socket_buffer *)lua_touserdata(L,1);
  if (psVar6 == (socket_buffer *)0x0) {
    iVar2 = luaL_error(L,"Need buffer object at param 1");
    return iVar2;
  }
  iVar2 = lua_type(L,2);
  local_50 = 0;
  local_40 = luaL_checklstring(L,3,&local_50);
  pbVar12 = psVar6->head;
  if (pbVar12 != (buffer_node *)0x0) {
    skip = (int)local_50;
    uVar7 = local_50 & 0xffffffff;
    if ((int)local_50 <= psVar6->size) {
      iVar18 = psVar6->offset;
      iVar10 = pbVar12->sz - iVar18;
      uVar8 = (psVar6->size - (int)local_50) + 1;
      uVar5 = 0;
      pbVar11 = pbVar12;
      __s2 = local_40;
      uVar16 = uVar7;
      local_48 = psVar6;
      uVar9 = uVar8;
      iVar17 = iVar18;
      do {
        do {
          lVar13 = (long)iVar18;
          uVar14 = pbVar11->sz - lVar13;
          iVar4 = (int)uVar14;
          iVar15 = (int)uVar16;
          if (iVar15 - iVar4 == 0 || iVar15 < iVar4) {
            iVar4 = bcmp(pbVar11->msg + lVar13,__s2,(long)iVar15);
            uVar9 = (uint)(iVar4 == 0);
            bVar1 = false;
          }
          else if ((iVar4 < 1) ||
                  (local_38 = pbVar11, iVar3 = bcmp(pbVar11->msg + lVar13,__s2,uVar14 & 0xffffffff),
                  pbVar11 = local_38, iVar3 == 0)) {
            pbVar11 = pbVar11->next;
            __s2 = __s2 + uVar14;
            bVar1 = true;
            iVar18 = 0;
            uVar16 = (ulong)(uint)(iVar15 - iVar4);
          }
          else {
            uVar9 = 0;
            bVar1 = false;
          }
          psVar6 = local_48;
        } while (bVar1);
        if ((uVar9 & 1) != 0) {
          if (iVar2 == 5) {
            pop_lstring(L,local_48,uVar5 + skip,skip);
            psVar6->size = psVar6->size - (uVar5 + (int)local_50);
            return 1;
          }
          lua_pushboolean(L,1);
          return 1;
        }
        iVar10 = iVar10 + -1;
        if (iVar10 == 0) {
          pbVar12 = pbVar12->next;
          if (pbVar12 == (buffer_node *)0x0) {
            return 0;
          }
          iVar10 = pbVar12->sz;
          iVar18 = 0;
        }
        else {
          iVar18 = iVar17 + 1;
        }
        uVar5 = uVar5 + 1;
        pbVar11 = pbVar12;
        __s2 = local_40;
        uVar16 = uVar7;
        uVar9 = uVar8;
        iVar17 = iVar18;
      } while (uVar5 != uVar8);
    }
  }
  return 0;
}

Assistant:

static int
lreadline(lua_State *L) {
	struct socket_buffer * sb = lua_touserdata(L, 1);
	if (sb == NULL) {
		return luaL_error(L, "Need buffer object at param 1");
	}
	// only check
	bool check = !lua_istable(L, 2);
	size_t seplen = 0;
	const char *sep = luaL_checklstring(L,3,&seplen);
	int i;
	struct buffer_node *current = sb->head;
	if (current == NULL)
		return 0;
	int from = sb->offset;
	int bytes = current->sz - from;
	for (i=0;i<=sb->size - (int)seplen;i++) {
		if (check_sep(current, from, sep, seplen)) {
			if (check) {
				lua_pushboolean(L,true);
			} else {
				pop_lstring(L, sb, i+seplen, seplen);
				sb->size -= i+seplen;
			}
			return 1;
		}
		++from;
		--bytes;
		if (bytes == 0) {
			current = current->next;
			from = 0;
			if (current == NULL)
				break;
			bytes = current->sz;
		}
	}
	return 0;
}